

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall
Liby::http::HttpClient::HttpClient(HttpClient *this,EventLoopGroup *group,string *host)

{
  allocator local_59;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  undefined1 local_38 [16];
  
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  (this->parser_).super_Reply.content_.buffer_ = (char *)0x0;
  (this->parser_).super_Reply.content_.leftIndex_ = 0;
  (this->parser_).super_Reply.content_.rightIndex_ = 0;
  (this->parser_).super_Reply.content_.capacity_ = 0;
  (this->parser_).super_Reply.headers_._M_h._M_buckets =
       &(this->parser_).super_Reply.headers_._M_h._M_single_bucket;
  (this->parser_).super_Reply.headers_._M_h._M_bucket_count = 1;
  (this->parser_).super_Reply.headers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->parser_).super_Reply.headers_._M_h._M_element_count = 0;
  (this->parser_).super_Reply.headers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->parser_).bytes_ = 0;
  (this->parser_).progress_ = 0;
  (this->parser_).super_Reply.headers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->parser_).super_Reply.headers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->requestLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->requestLists_;
  (this->requestLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->requestLists_;
  (this->requestLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->sendReqeustLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->sendReqeustLists_;
  (this->sendReqeustLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->sendReqeustLists_;
  (this->sendReqeustLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::string((string *)local_58._M_pod_data,"80",&local_59);
  EventLoopGroup::creatTcpClient((EventLoopGroup *)local_38,(string *)group,host);
  std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:11:29)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:11:29)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  TcpClient::onConnect
            ((this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(Connector *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return;
}

Assistant:

HttpClient::HttpClient(EventLoopGroup &group, const std::string &host) {
    host_ = host;
    http_client_ = group.creatTcpClient(host, "80");
    http_client_->onConnect([this](ConnPtr conn) { handleConnection(conn); });
}